

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sight.cpp
# Opt level: O3

bool __thiscall SightCheck::P_SightCheckLine(SightCheck *this,line_t_conflict *ld)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  intercept_t *piVar9;
  ulong uVar10;
  bool bVar11;
  
  bVar11 = true;
  if (ld->validcount != validcount) {
    ld->validcount = validcount;
    dVar1 = (ld->v1->p).X;
    dVar2 = (this->Trace).x;
    dVar3 = (this->Trace).y;
    dVar5 = (this->Trace).dx;
    dVar6 = (this->Trace).dy;
    dVar4 = (ld->v1->p).Y;
    if ((1.52587890625e-05 < (dVar2 - dVar1) * dVar6 + (dVar4 - dVar3) * dVar5 ==
         (dVar2 - (ld->v2->p).X) * dVar6 + ((ld->v2->p).Y - dVar3) * dVar5 <= 1.52587890625e-05) &&
       (dVar7 = (ld->delta).X, dVar8 = (ld->delta).Y,
       1.52587890625e-05 < (dVar1 - dVar2) * dVar8 + (dVar3 - dVar4) * dVar7 ==
       (dVar1 - (dVar2 + dVar5)) * dVar8 + ((dVar3 + dVar6) - dVar4) * dVar7 <= 1.52587890625e-05))
    {
      if (((ld->backsector == (sector_t_conflict *)0x0) || ((ld->flags & 0x4000004) != 4)) ||
         (((short)ld->flags < 0 &&
          (((this->Flags & 4U) == 0 ||
           (((this->Flags & 2U) == 0 &&
            ((((ld->activation & 8) == 0 || ((ld->special != 0xe2 && (ld->special != 0x50)))) ||
             ((ld->args[1] != 0 && (ld->args[1] != level.levelnum)))))))))))) {
        bVar11 = false;
      }
      else {
        sightcounts[3] = sightcounts[3] + 1;
        TArray<intercept_t,_intercept_t>::Grow(&intercepts,1);
        piVar9 = intercepts.Array;
        uVar10 = (ulong)intercepts.Count;
        intercepts.Array[uVar10].isaline = true;
        piVar9[uVar10].d.line = ld;
        intercepts.Count = intercepts.Count + 1;
      }
    }
  }
  return bVar11;
}

Assistant:

bool SightCheck::P_SightCheckLine (line_t *ld)
{
	divline_t dl;

	if (ld->validcount == validcount)
	{
		return true;
	}
	ld->validcount = validcount;
	if (P_PointOnDivlineSide (ld->v1->fPos(), &Trace) ==
		P_PointOnDivlineSide (ld->v2->fPos(), &Trace))
	{
		return true;		// line isn't crossed
	}
	P_MakeDivline (ld, &dl);
	if (P_PointOnDivlineSide (Trace.x, Trace.y, &dl) ==
		P_PointOnDivlineSide (Trace.x+Trace.dx, Trace.y+Trace.dy, &dl))
	{
		return true;		// line isn't crossed
	}

	// try to early out the check
	if (!ld->backsector || !(ld->flags & ML_TWOSIDED) || (ld->flags & ML_BLOCKSIGHT))
		return false;	// stop checking

	// [RH] don't see past block everything lines
	if (ld->flags & ML_BLOCKEVERYTHING)
	{
		if (!(Flags & SF_SEEPASTBLOCKEVERYTHING))
		{
			return false;
		}
		// Pretend the other side is invisible if this is not an impact line
		// that runs a script on the current map. Used to prevent monsters
		// from trying to attack through a block everything line unless
		// there's a chance their attack will make it nonblocking.
		if (!(Flags & SF_SEEPASTSHOOTABLELINES))
		{
			if (!(ld->activation & SPAC_Impact))
			{
				return false;
			}
			if (ld->special != ACS_Execute && ld->special != ACS_ExecuteAlways)
			{
				return false;
			}
			if (ld->args[1] != 0 && ld->args[1] != level.levelnum)
			{
				return false;
			}
		}
	}

	sightcounts[3]++;
	// store the line for later intersection testing
	intercept_t newintercept;
	newintercept.isaline = true;
	newintercept.d.line = ld;
	intercepts.Push (newintercept);

	return true;
}